

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O0

iterator __thiscall
cmLinkedTree<cmState::SnapshotDataType>::Push
          (cmLinkedTree<cmState::SnapshotDataType> *this,iterator it,SnapshotDataType *t)

{
  iterator iVar1;
  iterator iVar2;
  SnapshotDataType local_130;
  cmLinkedTree<cmState::SnapshotDataType> *local_48;
  cmLinkedTree<cmState::SnapshotDataType> *pcStack_40;
  SnapshotDataType *local_38;
  SnapshotDataType *t_local;
  cmLinkedTree<cmState::SnapshotDataType> *this_local;
  iterator it_local;
  
  pcStack_40 = (cmLinkedTree<cmState::SnapshotDataType> *)it.Position;
  local_48 = it.Tree;
  local_38 = t;
  t_local = (SnapshotDataType *)this;
  this_local = local_48;
  it_local.Tree = pcStack_40;
  cmState::SnapshotDataType::SnapshotDataType(&local_130,t);
  iVar2.Position = (PositionType)pcStack_40;
  iVar2.Tree = local_48;
  iVar2 = Push_impl(this,iVar2,&local_130);
  it_local.Position = (PositionType)iVar2.Tree;
  cmState::SnapshotDataType::~SnapshotDataType(&local_130);
  iVar1.Position = iVar2.Position;
  iVar1.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)it_local.Position;
  return iVar1;
}

Assistant:

iterator Push(iterator it, T t)
  {
    return Push_impl(it, t);
  }